

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O1

bool __thiscall
miniros::RPCManager::bindEx(RPCManager *this,string *function_name,XMLRPCFuncEx *cb,void *object)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  iterator iVar3;
  XMLRPCCallWrapperEx *this_00;
  mapped_type *pmVar4;
  FunctionInfo info;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  _Any_data local_88;
  code *local_78;
  undefined8 uStack_70;
  _Any_data local_68;
  code *local_58;
  undefined8 uStack_50;
  void *local_48;
  __shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2> _Stack_40;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->functions_mutex_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
          ::find(&(this->functions_)._M_t,function_name);
  p_Var1 = &(this->functions_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
    local_a8 = &local_98;
    local_a0 = 0;
    local_98 = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_78 = (code *)0x0;
    uStack_70 = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_58 = (code *)0x0;
    uStack_50 = 0;
    local_48 = (void *)0x0;
    _Stack_40._M_ptr = (element_type *)0x0;
    _Stack_40._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::_M_assign((string *)&local_a8);
    std::
    function<int_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcServerConnection_*)>
    ::operator=((function<int_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcServerConnection_*)>
                 *)&local_68,cb);
    this_00 = (XMLRPCCallWrapperEx *)operator_new(0x50);
    XMLRPCCallWrapperEx::XMLRPCCallWrapperEx(this_00,function_name,cb,&this->server_);
    std::__shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2>::
    reset<miniros::XMLRPCCallWrapperEx>(&_Stack_40,this_00);
    local_48 = object;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
             ::operator[](&this->functions_,function_name);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::function<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)>::operator=
              (&pmVar4->function,
               (function<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)> *)&local_88);
    std::
    function<int_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcServerConnection_*)>
    ::operator=(&pmVar4->functionEx,
                (function<int_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcServerConnection_*)>
                 *)&local_68);
    pmVar4->object = local_48;
    (pmVar4->wrapper).super___shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = _Stack_40._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar4->wrapper).
                super___shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&_Stack_40._M_refcount);
    if (_Stack_40._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_refcount._M_pi);
    }
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->functions_mutex_);
  return (_Rb_tree_header *)iVar3._M_node == p_Var1;
}

Assistant:

bool RPCManager::bindEx(const std::string& function_name, const XMLRPCFuncEx& cb, void* object)
{
  std::scoped_lock<std::mutex> lock(functions_mutex_);
  if (functions_.find(function_name) != functions_.end())
  {
    return false;
  }

  FunctionInfo info;
  info.name = function_name;
  info.functionEx = cb;
  info.wrapper.reset(new XMLRPCCallWrapperEx(function_name, cb, &server_));
  info.object = object;
  functions_[function_name] = info;

  return true;
}